

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_data_to_file.cpp
# Opt level: O0

void initialize_folder_name(void)

{
  char current_time [32];
  char folder_name [32];
  time_t now;
  tm *timenow;
  char acStack_58 [16];
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  time_t local_10;
  tm *local_8;
  
  local_10 = time((time_t *)0x0);
  local_8 = gmtime(&local_10);
  create_folder((char *)folder_name._16_8_);
  strftime(acStack_58,0x20,"/%Y_%m_%d_%H_%M",local_8);
  nested_folder = concat(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  create_folder((char *)folder_name._16_8_);
  return;
}

Assistant:

void initialize_folder_name() {
    // get the current time
    struct tm* timenow;
    time_t now = time(NULL);
    timenow = gmtime(&now);
    char folder_name[32] = "../benchmarking_files";
    create_folder(folder_name);

    char current_time[32];
    strftime(current_time, sizeof(current_time), "/%Y_%m_%d_%H_%M", timenow);

    nested_folder = concat(folder_name, current_time);
    create_folder(nested_folder);
}